

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

bool Rml::ElementUtilities::PositionElement(Element *element,Vector2f offset,PositionAnchor anchor)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Element *this;
  Box *this_00;
  ElementScroll *pEVar3;
  float fVar4;
  Vector2f local_bc;
  Vector2f relative_offset;
  Vector2f resolved_offset;
  Vector2f element_block;
  Vector2f local_9c;
  Vector2f local_94;
  float local_80 [2];
  undefined1 local_78 [8];
  Box box;
  Vector2f containing_block;
  Box *parent_box;
  Element *parent;
  PositionAnchor anchor_local;
  Element *element_local;
  Vector2f offset_local;
  
  this = Element::GetParentNode(element);
  if (this == (Element *)0x0) {
    offset_local.x._3_1_ = false;
  }
  else {
    this_00 = Element::GetBox(this);
    box.area_edges[2]._8_8_ = Box::GetSize(this_00);
    pEVar3 = Element::GetElementScroll(this);
    fVar4 = ElementScroll::GetScrollbarSize(pEVar3,VERTICAL);
    box.area_edges[2][2] = box.area_edges[2][2] - fVar4;
    pEVar3 = Element::GetElementScroll(this);
    fVar4 = ElementScroll::GetScrollbarSize(pEVar3,HORIZONTAL);
    box.area_edges[2][3] = box.area_edges[2][3] - fVar4;
    Box::Box((Box *)local_78);
    local_80[0] = box.area_edges[2][2];
    local_80[1] = box.area_edges[2][3];
    LayoutDetails::BuildBox((Box *)local_78,(Vector2f)box.area_edges[2]._8_8_,element,Block);
    local_94 = Box::GetSize((Box *)local_78);
    if (local_94.y < 0.0) {
      VVar1 = Box::GetSize((Box *)local_78);
      element_block.x = VVar1.x;
      Vector2<float>::Vector2(&local_9c,element_block.x,box.area_edges[2][3]);
      Box::SetContent((Box *)local_78,local_9c);
    }
    Element::SetBox(element,(Box *)local_78);
    VVar1 = Box::GetSize((Box *)local_78,Margin);
    relative_offset.y = offset.y;
    fVar4 = relative_offset.y;
    VVar2 = offset;
    if ((anchor & RIGHT) != 0) {
      resolved_offset.x = VVar1.x;
      element_local._4_4_ = offset.x;
      relative_offset.x = box.area_edges[2][2] - (resolved_offset.x + element_local._4_4_);
      VVar2 = relative_offset;
    }
    relative_offset = VVar2;
    if ((anchor & BOTTOM) != 0) {
      resolved_offset.y = VVar1.y;
      relative_offset.y = box.area_edges[2][3] - (resolved_offset.y + fVar4);
    }
    local_bc = Box::GetPosition(this_00,Content);
    Vector2<float>::operator+=(&local_bc,relative_offset);
    fVar4 = Box::GetEdge((Box *)local_78,Margin,Left);
    local_bc.x = local_bc.x + fVar4;
    fVar4 = Box::GetEdge((Box *)local_78,Margin,Top);
    local_bc.y = local_bc.y + fVar4;
    Element::SetOffset(element,local_bc,this,false);
    offset_local.x._3_1_ = true;
    Box::~Box((Box *)local_78);
  }
  return offset_local.x._3_1_;
}

Assistant:

bool ElementUtilities::PositionElement(Element* element, Vector2f offset, PositionAnchor anchor)
{
	Element* parent = element->GetParentNode();
	if (!parent)
		return false;

	const Box& parent_box = parent->GetBox();
	Vector2f containing_block = parent_box.GetSize();
	containing_block.x -= parent->GetElementScroll()->GetScrollbarSize(ElementScroll::VERTICAL);
	containing_block.y -= parent->GetElementScroll()->GetScrollbarSize(ElementScroll::HORIZONTAL);

	Box box;
	LayoutDetails::BuildBox(box, containing_block, element);
	if (box.GetSize().y < 0.f)
		box.SetContent(Vector2f(box.GetSize().x, containing_block.y));
	element->SetBox(box);

	Vector2f element_block = box.GetSize(BoxArea::Margin);
	Vector2f resolved_offset = offset;

	if (anchor & RIGHT)
		resolved_offset.x = containing_block.x - (element_block.x + offset.x);
	if (anchor & BOTTOM)
		resolved_offset.y = containing_block.y - (element_block.y + offset.y);

	// Position element relative to its parent.
	Vector2f relative_offset = parent_box.GetPosition(BoxArea::Content);
	relative_offset += resolved_offset;
	relative_offset.x += box.GetEdge(BoxArea::Margin, BoxEdge::Left);
	relative_offset.y += box.GetEdge(BoxArea::Margin, BoxEdge::Top);

	element->SetOffset(relative_offset, parent);

	return true;
}